

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void spanExpr(ExprSpan *pOut,Parse *pParse,int op,Token t)

{
  Expr *pEVar1;
  char *__src;
  Expr *z;
  ulong __n;
  
  __src = t.z;
  __n = (ulong)t.n;
  pEVar1 = (Expr *)sqlite3DbMallocRawNN(pParse->db,__n + 0x49);
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->op = '\0';
    pEVar1->affinity = '\0';
    *(undefined2 *)&pEVar1->field_0x2 = 0;
    pEVar1->flags = 0;
    (pEVar1->u).zToken = (char *)0x0;
    pEVar1->iColumn = 0;
    pEVar1->iAgg = 0;
    pEVar1->iRightJoinTable = 0;
    pEVar1->op2 = '\0';
    pEVar1->field_0x37 = 0;
    pEVar1->pAggInfo = (AggInfo *)0x0;
    (pEVar1->x).pList = (ExprList *)0x0;
    pEVar1->nHeight = 0;
    pEVar1->iTable = 0;
    pEVar1->pLeft = (Expr *)0x0;
    pEVar1->pRight = (Expr *)0x0;
    pEVar1->pTab = (Table *)0x0;
    pEVar1->op = (u8)op;
    pEVar1->flags = 0x800000;
    pEVar1->iAgg = -1;
    z = pEVar1 + 1;
    (pEVar1->u).zToken = (char *)z;
    memcpy(z,__src,__n);
    (&pEVar1[1].op)[__n] = '\0';
    if ((char)""[pEVar1[1].op] < '\0') {
      if (pEVar1[1].op == 0x22) {
        pEVar1->flags = 0x800040;
      }
      sqlite3Dequote((char *)z);
    }
    pEVar1->nHeight = 1;
  }
  pOut->pExpr = pEVar1;
  pOut->zStart = __src;
  pOut->zEnd = __src + __n;
  return;
}

Assistant:

static void spanExpr(ExprSpan *pOut, Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      memset(p, 0, sizeof(Expr));
      p->op = (u8)op;
      p->flags = EP_Leaf;
      p->iAgg = -1;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      if( sqlite3Isquote(p->u.zToken[0]) ){
        if( p->u.zToken[0]=='"' ) p->flags |= EP_DblQuoted;
        sqlite3Dequote(p->u.zToken);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif  
    }
    pOut->pExpr = p;
    pOut->zStart = t.z;
    pOut->zEnd = &t.z[t.n];
  }